

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::PathBuilderKeyRolloverTest_TestDuplicateIntermediates_Test::TestBody
          (PathBuilderKeyRolloverTest_TestDuplicateIntermediates_Test *this)

{
  __node_base_ptr *pp_Var1;
  _Invoker_type *this_00;
  bool bVar2;
  element_type *peVar3;
  uint8_t *data;
  size_t len;
  CRYPTO_BUFFER *__p;
  char *pcVar4;
  reference pvVar5;
  pointer pCVar6;
  const_reference pvVar7;
  __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  char *pcVar8;
  string *val;
  Message *message;
  shared_ptr<const_bssl::ParsedCertificate> *this_02;
  AssertHelper local_5c0;
  Message local_5b8;
  StatusCode local_5b0;
  StatusCode local_5ac;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_10;
  VerifyError error;
  Message local_560;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_9;
  Message local_540;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_8;
  Message local_520;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_7;
  Message local_500;
  size_type local_4f8;
  uint local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_6;
  CertPathBuilderResultPath *path1;
  AssertHelper local_4b0;
  Message local_4a8;
  bool local_499;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__2;
  Message local_480;
  uint local_474;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_5;
  Message local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_4;
  Message local_438;
  Span<const_unsigned_char> local_430;
  Span<const_unsigned_char> local_420;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_3;
  Message local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_2;
  Message local_3d8;
  size_type local_3d0;
  uint local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_1;
  CertPathBuilderResultPath *path0;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_358;
  Message local_350;
  size_type local_348;
  uint local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar;
  AssertHelper local_308;
  Message local_300;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_;
  Result result;
  undefined1 local_2a0 [8];
  CertPathBuilder path_builder;
  undefined1 local_1f0 [8];
  AsyncCertIssuerSourceStatic async_certs;
  undefined1 local_170 [8];
  CertIssuerSourceStatic sync_certs2;
  undefined1 local_120 [8];
  CertIssuerSourceStatic sync_certs1;
  undefined1 local_d0 [8];
  TrustStoreInMemory trust_store;
  ParseCertificateOptions local_49;
  Span<const_unsigned_char> local_48;
  Span<const_unsigned_char> local_38;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_28;
  shared_ptr<const_bssl::ParsedCertificate> oldintermediate_dupe;
  PathBuilderKeyRolloverTest_TestDuplicateIntermediates_Test *this_local;
  
  this_02 = &(this->super_PathBuilderKeyRolloverTest).oldintermediate_;
  oldintermediate_dupe.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peVar3 = ::std::
           __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_02);
  local_38 = (Span<const_unsigned_char>)ParsedCertificate::der_cert(peVar3);
  data = bssl::der::Input::data((Input *)&local_38);
  peVar3 = ::std::
           __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_02);
  local_48 = (Span<const_unsigned_char>)ParsedCertificate::der_cert(peVar3);
  len = bssl::der::Input::size((Input *)&local_48);
  __p = CRYPTO_BUFFER_new(data,len,(CRYPTO_BUFFER_POOL *)0x0);
  ::std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&local_28,__p);
  local_49.allow_invalid_serial_numbers = false;
  ParsedCertificate::Create
            ((ParsedCertificate *)&stack0xffffffffffffffe0,(UniquePtr<CRYPTO_BUFFER> *)&local_28,
             &local_49,(CertErrors *)0x0);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  TrustStoreInMemory::TrustStoreInMemory((TrustStoreInMemory *)local_d0);
  pp_Var1 = &sync_certs1.intermediates_._M_h._M_single_bucket;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)pp_Var1,
             &(this->super_PathBuilderKeyRolloverTest).newroot_);
  TrustStoreInMemory::AddTrustAnchor
            ((TrustStoreInMemory *)local_d0,(shared_ptr<const_bssl::ParsedCertificate> *)pp_Var1);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)
             &sync_certs1.intermediates_._M_h._M_single_bucket);
  CertIssuerSourceStatic::CertIssuerSourceStatic((CertIssuerSourceStatic *)local_120);
  pp_Var1 = &sync_certs2.intermediates_._M_h._M_single_bucket;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)pp_Var1,
             &(this->super_PathBuilderKeyRolloverTest).oldintermediate_);
  CertIssuerSourceStatic::AddCert
            ((CertIssuerSourceStatic *)local_120,
             (shared_ptr<const_bssl::ParsedCertificate> *)pp_Var1);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)
             &sync_certs2.intermediates_._M_h._M_single_bucket);
  CertIssuerSourceStatic::CertIssuerSourceStatic((CertIssuerSourceStatic *)local_170);
  this_00 = &async_certs.async_get_callback_._M_invoker;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)this_00,
             (shared_ptr<const_bssl::ParsedCertificate> *)&stack0xffffffffffffffe0);
  CertIssuerSourceStatic::AddCert
            ((CertIssuerSourceStatic *)local_170,
             (shared_ptr<const_bssl::ParsedCertificate> *)this_00);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)
             &async_certs.async_get_callback_._M_invoker);
  AsyncCertIssuerSourceStatic::AsyncCertIssuerSourceStatic((AsyncCertIssuerSourceStatic *)local_1f0)
  ;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&path_builder.valid_path_count_,
             &(this->super_PathBuilderKeyRolloverTest).newintermediate_);
  AsyncCertIssuerSourceStatic::AddCert
            ((AsyncCertIssuerSourceStatic *)local_1f0,
             (shared_ptr<const_bssl::ParsedCertificate> *)&path_builder.valid_path_count_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&path_builder.valid_path_count_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit,
             &(this->super_PathBuilderKeyRolloverTest).target_);
  pcVar8 = (char *)0x0;
  CertPathBuilder::CertPathBuilder
            ((CertPathBuilder *)local_2a0,
             (shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit,
             (TrustStore *)local_d0,
             &(this->super_PathBuilderKeyRolloverTest).delegate_.super_CertPathBuilderDelegate,
             &(this->super_PathBuilderKeyRolloverTest).time_,ANY_EKU,
             (this->super_PathBuilderKeyRolloverTest).initial_explicit_policy_,
             &(this->super_PathBuilderKeyRolloverTest).user_initial_policy_set_,
             (this->super_PathBuilderKeyRolloverTest).initial_policy_mapping_inhibit_,
             (this->super_PathBuilderKeyRolloverTest).initial_any_policy_inhibit_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit);
  CertPathBuilder::AddCertIssuerSource((CertPathBuilder *)local_2a0,(CertIssuerSource *)local_120);
  CertPathBuilder::AddCertIssuerSource((CertPathBuilder *)local_2a0,(CertIssuerSource *)local_170);
  CertPathBuilder::AddCertIssuerSource((CertPathBuilder *)local_2a0,(CertIssuerSource *)local_1f0);
  CertPathBuilder::Run((Result *)&gtest_ar_.message_,(CertPathBuilder *)local_2a0);
  local_2f1 = CertPathBuilder::Result::HasValidPath((Result *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar2) {
    testing::Message::Message(&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2f0,
               (AssertionResult *)"result.HasValidPath()","false","true",pcVar8);
    pcVar4 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x6d3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  local_33c = 2;
  local_348 = ::std::
              vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
              ::size((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                      *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_338,"2U","result.paths.size()",&local_33c,&local_348);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x6d4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message(&local_350);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pvVar5 = ::std::
             vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ::operator[]((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                           *)&gtest_ar_.message_,0);
    pCVar6 = ::std::
             unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ::operator->(pvVar5);
    bVar2 = CertPathBuilderResultPath::IsValid(pCVar6);
    local_371 = (bool)(~bVar2 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_370,&local_371,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
    if (!bVar2) {
      testing::Message::Message(&local_380);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&path0,(internal *)local_370,
                 (AssertionResult *)"result.paths[0]->IsValid()","true","false",pcVar8);
      pcVar4 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_388,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x6d8,pcVar4);
      testing::internal::AssertHelper::operator=(&local_388,&local_380);
      testing::internal::AssertHelper::~AssertHelper(&local_388);
      ::std::__cxx11::string::~string((string *)&path0);
      testing::Message::~Message(&local_380);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
    pvVar5 = ::std::
             vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ::operator[]((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                           *)&gtest_ar_.message_,0);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )::std::
           unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
           ::operator*(pvVar5);
    local_3c4 = 3;
    local_3d0 = ::std::
                vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                ::size((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                        *)gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_3c0,"3U","path0.certs.size()",&local_3c4,&local_3d0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
    if (!bVar2) {
      testing::Message::Message(&local_3d8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x6db,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_3d8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pvVar7 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,0);
      testing::internal::EqHelper::
      Compare<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_nullptr>
                ((EqHelper *)local_3f0,"target_","path0.certs[0]",
                 &(this->super_PathBuilderKeyRolloverTest).target_,pvVar7);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
      if (!bVar2) {
        testing::Message::Message(&local_3f8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6dc,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_3f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
      peVar3 = ::std::
               __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_PathBuilderKeyRolloverTest).oldintermediate_);
      local_420 = (Span<const_unsigned_char>)ParsedCertificate::der_cert(peVar3);
      this_01 = (__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)::std::
                   vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                 *)gtest_ar_1.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl,1);
      peVar3 = ::std::
               __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      local_430 = (Span<const_unsigned_char>)ParsedCertificate::der_cert(peVar3);
      testing::internal::EqHelper::Compare<bssl::der::Input,_bssl::der::Input,_nullptr>
                ((EqHelper *)local_410,"oldintermediate_->der_cert()","path0.certs[1]->der_cert()",
                 (Input *)&local_420,(Input *)&local_430);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
      if (!bVar2) {
        testing::Message::Message(&local_438);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6df,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_438);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_438);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
      pvVar7 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,2);
      testing::internal::EqHelper::
      Compare<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_nullptr>
                ((EqHelper *)local_450,"newroot_","path0.certs[2]",
                 &(this->super_PathBuilderKeyRolloverTest).newroot_,pvVar7);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
      if (!bVar2) {
        testing::Message::Message(&local_458);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e0,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_458);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_458);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
      local_474 = 1;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_470,"1U","result.best_result_index",&local_474,
                 (unsigned_long *)
                 &result.paths.
                  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
      if (!bVar2) {
        testing::Message::Message(&local_480);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e4,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_480)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_480);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
      pvVar5 = ::std::
               vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
               ::operator[]((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                             *)&gtest_ar_.message_,1);
      pCVar6 = ::std::
               unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ::operator->(pvVar5);
      local_499 = CertPathBuilderResultPath::IsValid(pCVar6);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_498,&local_499,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
      if (!bVar2) {
        testing::Message::Message(&local_4a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&path1,(internal *)local_498,
                   (AssertionResult *)"result.paths[1]->IsValid()","false","true",pcVar8);
        pcVar8 = (char *)::std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e5,pcVar8);
        testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        ::std::__cxx11::string::~string((string *)&path1);
        testing::Message::~Message(&local_4a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
      pvVar5 = ::std::
               vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
               ::operator[]((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                             *)&gtest_ar_.message_,1);
      gtest_ar_6.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )::std::
             unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ::operator*(pvVar5);
      local_4ec = 3;
      local_4f8 = ::std::
                  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ::size((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                          *)gtest_ar_6.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_4e8,"3U","path1.certs.size()",&local_4ec,&local_4f8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
      if (!bVar2) {
        testing::Message::Message(&local_500);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e7,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_500);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_500);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pvVar7 = ::std::
                 vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                               *)gtest_ar_6.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,0);
        testing::internal::EqHelper::
        Compare<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_nullptr>
                  ((EqHelper *)local_518,"target_","path1.certs[0]",
                   &(this->super_PathBuilderKeyRolloverTest).target_,pvVar7);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
        if (!bVar2) {
          testing::Message::Message(&local_520);
          pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6e8,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_8.message_,&local_520);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
          testing::Message::~Message(&local_520);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
        pvVar7 = ::std::
                 vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                               *)gtest_ar_6.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,1);
        testing::internal::EqHelper::
        Compare<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_nullptr>
                  ((EqHelper *)local_538,"newintermediate_","path1.certs[1]",
                   &(this->super_PathBuilderKeyRolloverTest).newintermediate_,pvVar7);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
        if (!bVar2) {
          testing::Message::Message(&local_540);
          pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6e9,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_540);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_540);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
        pvVar7 = ::std::
                 vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                               *)gtest_ar_6.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,2);
        testing::internal::EqHelper::
        Compare<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_nullptr>
                  ((EqHelper *)local_558,"newroot_","path1.certs[2]",
                   &(this->super_PathBuilderKeyRolloverTest).newroot_,pvVar7);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
        if (!bVar2) {
          testing::Message::Message(&local_560);
          pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6ea,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8),&local_560);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8));
          testing::Message::~Message(&local_560);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
        CertPathBuilder::Result::GetBestPathVerifyError
                  ((VerifyError *)&gtest_ar_10.message_,(Result *)&gtest_ar_.message_);
        local_5ac = VerifyError::Code((VerifyError *)&gtest_ar_10.message_);
        local_5b0 = PATH_VERIFIED;
        testing::internal::EqHelper::
        Compare<bssl::VerifyError::StatusCode,_bssl::VerifyError::StatusCode,_nullptr>
                  ((EqHelper *)local_5a8,"error.Code()","VerifyError::StatusCode::PATH_VERIFIED",
                   &local_5ac,&local_5b0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
        if (!bVar2) {
          testing::Message::Message(&local_5b8);
          val = VerifyError::DiagnosticString_abi_cxx11_((VerifyError *)&gtest_ar_10.message_);
          message = testing::Message::operator<<(&local_5b8,val);
          pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_5c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6ed,pcVar8);
          testing::internal::AssertHelper::operator=(&local_5c0,message);
          testing::internal::AssertHelper::~AssertHelper(&local_5c0);
          testing::Message::~Message(&local_5b8);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        VerifyError::~VerifyError((VerifyError *)&gtest_ar_10.message_);
      }
    }
  }
  CertPathBuilder::Result::~Result((Result *)&gtest_ar_.message_);
  CertPathBuilder::~CertPathBuilder((CertPathBuilder *)local_2a0);
  AsyncCertIssuerSourceStatic::~AsyncCertIssuerSourceStatic
            ((AsyncCertIssuerSourceStatic *)local_1f0);
  CertIssuerSourceStatic::~CertIssuerSourceStatic((CertIssuerSourceStatic *)local_170);
  CertIssuerSourceStatic::~CertIssuerSourceStatic((CertIssuerSourceStatic *)local_120);
  TrustStoreInMemory::~TrustStoreInMemory((TrustStoreInMemory *)local_d0);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

TEST_F(PathBuilderKeyRolloverTest, TestDuplicateIntermediates) {
  // Create a separate copy of oldintermediate.
  std::shared_ptr<const ParsedCertificate> oldintermediate_dupe(
      ParsedCertificate::Create(
          bssl::UniquePtr<CRYPTO_BUFFER>(
              CRYPTO_BUFFER_new(oldintermediate_->der_cert().data(),
                                oldintermediate_->der_cert().size(), nullptr)),
          {}, nullptr));

  // Only newroot is a trusted root.
  TrustStoreInMemory trust_store;
  trust_store.AddTrustAnchor(newroot_);

  // The oldintermediate is supplied synchronously by |sync_certs1| and
  // another copy of oldintermediate is supplied synchronously by |sync_certs2|.
  // The path target <- oldintermediate <- newroot  should be built first,
  // though it won't verify. It should not be attempted again even though
  // oldintermediate was supplied twice.
  CertIssuerSourceStatic sync_certs1;
  sync_certs1.AddCert(oldintermediate_);
  CertIssuerSourceStatic sync_certs2;
  sync_certs2.AddCert(oldintermediate_dupe);

  // The newintermediate is supplied asynchronously, so the path
  // target <- newintermediate <- newroot should be tried second.
  AsyncCertIssuerSourceStatic async_certs;
  async_certs.AddCert(newintermediate_);

  CertPathBuilder path_builder(
      target_, &trust_store, &delegate_, time_, KeyPurpose::ANY_EKU,
      initial_explicit_policy_, user_initial_policy_set_,
      initial_policy_mapping_inhibit_, initial_any_policy_inhibit_);
  path_builder.AddCertIssuerSource(&sync_certs1);
  path_builder.AddCertIssuerSource(&sync_certs2);
  path_builder.AddCertIssuerSource(&async_certs);

  auto result = path_builder.Run();

  EXPECT_TRUE(result.HasValidPath());
  ASSERT_EQ(2U, result.paths.size());

  // Path builder will first attempt: target <- oldintermediate <- newroot
  // but it will fail since oldintermediate is signed by oldroot.
  EXPECT_FALSE(result.paths[0]->IsValid());
  const auto &path0 = *result.paths[0];

  ASSERT_EQ(3U, path0.certs.size());
  EXPECT_EQ(target_, path0.certs[0]);
  // Compare the DER instead of ParsedCertificate pointer, don't care which copy
  // of oldintermediate was used in the path.
  EXPECT_EQ(oldintermediate_->der_cert(), path0.certs[1]->der_cert());
  EXPECT_EQ(newroot_, path0.certs[2]);

  // Path builder will next attempt: target <- newintermediate <- newroot
  // which will succeed.
  EXPECT_EQ(1U, result.best_result_index);
  EXPECT_TRUE(result.paths[1]->IsValid());
  const auto &path1 = *result.paths[1];
  ASSERT_EQ(3U, path1.certs.size());
  EXPECT_EQ(target_, path1.certs[0]);
  EXPECT_EQ(newintermediate_, path1.certs[1]);
  EXPECT_EQ(newroot_, path1.certs[2]);

  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_VERIFIED)
      << error.DiagnosticString();
}